

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O1

void __thiscall MapLoader::MapLoader(MapLoader *this)

{
  (this->filePath)._M_dataplus._M_p = (pointer)&(this->filePath).field_2;
  (this->filePath)._M_string_length = 0;
  (this->filePath).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)&this->filePath,0,(char *)0x0,0x11d455);
  this->nodeCount = 0;
  this->map = (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)0x0;
  return;
}

Assistant:

MapLoader::MapLoader() {
  filePath = "";
  nodeCount = 0;
  map = nullptr; //initialize the graph to nullptr

}